

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_glossary_gnu(FILE *fp,void **argtable)

{
  arg_dstr_t ds_00;
  char *__s;
  arg_dstr_t ds;
  void **argtable_local;
  FILE *fp_local;
  
  ds_00 = arg_dstr_create();
  arg_print_glossary_gnu_ds(ds_00,argtable);
  __s = arg_dstr_cstr(ds_00);
  fputs(__s,(FILE *)fp);
  arg_dstr_destroy(ds_00);
  return;
}

Assistant:

void arg_print_glossary_gnu(FILE* fp, void** argtable) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_glossary_gnu_ds(ds, argtable);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}